

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall
QHostInfoRunnable::QHostInfoRunnable
          (QHostInfoRunnable *this,QString *hn,int i,QObject *receiver,SlotObjUniquePtr *slotObj)

{
  long lVar1;
  QHostInfoResult *in_RCX;
  undefined4 in_EDX;
  QRunnable *in_RDI;
  QObject *in_R8;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff98;
  QObject *receiver_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  receiver_00 = in_R8;
  QRunnable::QRunnable(in_RDI);
  *(undefined ***)in_RDI = &PTR_run_0049b448;
  QString::QString((QString *)in_R8,in_stack_ffffffffffffff98);
  *(undefined4 *)(in_RDI + 0x28) = in_EDX;
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)in_R8,
             (unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_ffffffffffffff98);
  QHostInfoResult::QHostInfoResult(in_RCX,receiver_00,(SlotObjUniquePtr *)in_RDI);
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)in_R8);
  QRunnable::setAutoDelete(in_RDI,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfoRunnable::QHostInfoRunnable(const QString &hn, int i, const QObject *receiver,
                                     QtPrivate::SlotObjUniquePtr slotObj)
    : toBeLookedUp{hn}, id{i}, resultEmitter{receiver, std::move(slotObj)}
{
    setAutoDelete(true);
}